

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall REPL::loop(REPL *this)

{
  pointer pvVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  istream *piVar5;
  ostream *poVar6;
  int i_1;
  Position PVar7;
  int i;
  Position PVar8;
  long lVar9;
  Position pos;
  int y;
  int x;
  string command;
  string buffer;
  istringstream ss;
  Position local_208;
  int local_200;
  int local_1fc;
  REPL *local_1f8;
  undefined1 *local_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [16];
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_1f8 = this;
  do {
    local_1d0 = local_1c0;
    local_1c8 = 0;
    local_1c0[0] = 0;
    cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x40);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_1d0,cVar3);
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_1d0,_S_in);
    local_1f0 = local_1e0;
    local_1e8 = 0;
    local_1e0[0] = 0;
    std::operator>>((istream *)local_1b0,(string *)&local_1f0);
    iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
    if (iVar4 == 0) {
LAB_0010270f:
      bVar2 = true;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar4 == 0) {
        piVar5 = (istream *)std::istream::operator>>((istream *)local_1b0,&local_208.x);
        piVar5 = (istream *)std::istream::operator>>(piVar5,&local_1fc);
        std::istream::operator>>(piVar5,&local_200);
        *(int *)(*(long *)&(local_1f8->board).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_208.x].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                (long)local_1fc * 4) = local_200;
        goto LAB_0010270f;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar4 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        goto LAB_0010270f;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar4 == 0) {
        PVar7.x = 0;
        PVar7.y = 0;
        do {
          lVar9 = 0;
          local_208 = PVar7;
          do {
            if (*(int *)(*(long *)&(((local_1f8->ai).board)->
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[(long)PVar7].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + lVar9 * 4) == 0) goto LAB_001025ea;
            lVar9 = lVar9 + 1;
            local_208 = (Position)((long)local_208 + 0x100000000);
          } while (lVar9 != 0xf);
          PVar7 = (Position)((long)PVar7 + 1);
        } while (PVar7 != (Position)0xf);
        local_208.x = 0;
        local_208.y = 0;
LAB_001025ea:
        *(undefined4 *)
         (*(long *)&(local_1f8->board).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_208.x].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl + (long)local_208.y * 4) =
             1;
        poVar6 = operator<<((ostream *)&std::cout,&local_208);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        goto LAB_0010270f;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar4 == 0) {
        piVar5 = (istream *)std::istream::operator>>((istream *)local_1b0,&local_1fc);
        std::istream::operator>>(piVar5,&local_200);
        pvVar1 = (local_1f8->board).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)
         (*(long *)&pvVar1[local_1fc].super__Vector_base<int,_std::allocator<int>_>._M_impl +
         (long)local_200 * 4) = 2;
        PVar8.x = 0;
        PVar8.y = 0;
        do {
          lVar9 = 0;
          local_208 = PVar8;
          do {
            if (*(int *)(*(long *)&(((local_1f8->ai).board)->
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[(long)PVar8].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + lVar9 * 4) == 0) goto LAB_001026bb;
            lVar9 = lVar9 + 1;
            local_208 = (Position)((long)local_208 + 0x100000000);
          } while (lVar9 != 0xf);
          PVar8 = (Position)((long)PVar8 + 1);
        } while (PVar8 != (Position)0xf);
        local_208.x = 0;
        local_208.y = 0;
LAB_001026bb:
        *(undefined4 *)
         (*(long *)&pvVar1[local_208.x].super__Vector_base<int,_std::allocator<int>_>._M_impl +
         (long)local_208.y * 4) = 1;
        poVar6 = operator<<((ostream *)&std::cout,&local_208);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        goto LAB_0010270f;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_1f0);
      if (iVar4 != 0) goto LAB_0010270f;
      bVar2 = false;
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0);
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0);
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void REPL::loop() {
    while (true) {
        string buffer;
        getline(cin, buffer);
        istringstream ss(buffer);

        string command;
        ss >> command;
        if (command == START) {
            ai.init();
        } else if (command == PLACE) {
            int x, y, z;
            ss >> x >> y >> z;
            board[x][y] = z;
        } else if (command == DONE) {
            cout << "OK" << endl;
        } else if (command == BEGIN) {
            Position pos = ai.begin();
            board[pos.x][pos.y] = ME;
            cout << pos << endl;
        } else if (command == TURN) {
            int x, y;
            ss >> x >> y;
            board[x][y] = OTHER;
            Position pos = ai.turn({x, y});
            board[pos.x][pos.y] = ME;
            cout << pos << endl;
        } else if (command == END) {
            break;
        }
    }
}